

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_language_server.cpp
# Opt level: O0

void __thiscall
cmakels::cmake_language_server::didChange
          (cmake_language_server *this,DidChangeTextDocumentParams *params)

{
  reference pvVar1;
  mapped_type *this_00;
  optional<cmListFile> local_58;
  DidChangeTextDocumentParams *local_18;
  DidChangeTextDocumentParams *params_local;
  cmake_language_server *this_local;
  
  local_18 = params;
  params_local = (DidChangeTextDocumentParams *)this;
  pvVar1 = std::
           vector<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
           ::operator[](&params->contentChanges,0);
  cmakels::parser::parse_listfile(&local_58,&pvVar1->text);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>_>_>
            ::operator[](&this->open_files_,(key_type *)params);
  std::optional<cmListFile>::operator=(this_00,&local_58);
  std::optional<cmListFile>::~optional(&local_58);
  return;
}

Assistant:

void cmake_language_server::didChange(
    protocol::DidChangeTextDocumentParams params) {
  open_files_[params.textDocument.uri] =
      parser::parse_listfile(params.contentChanges[0].text); // using full sync
  // TODO don't parse everytime: probably save the string and keep a cache
  // and keep a cache for parsed file
}